

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSizeTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::TextureCubeSizeCase::testFace(TextureCubeSizeCase *this,CubeFace face)

{
  ostringstream *this_00;
  RenderContext *context;
  TextureCube *pTVar1;
  pointer texCoord_00;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_02;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  RandomViewport viewport;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Sampler sampler;
  RandomViewport local_2a8;
  TextureFormat local_298;
  Surface local_290;
  vector<float,_std::allocator<float>_> local_278;
  Surface local_260;
  TextureCubeView local_248;
  Sampler local_20c;
  SurfaceAccess local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  undefined4 extraout_var_01;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_298 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_2a8,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),0x80,0x80,dVar4 + face);
  tcu::Surface::Surface(&local_290,local_2a8.width,local_2a8.height);
  tcu::Surface::Surface(&local_260,local_2a8.width,local_2a8.height);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var_01,iVar3);
  bVar7 = 8 - *(char *)(lVar6 + 8);
  uVar8 = 0;
  if (0 < *(int *)(lVar6 + 0x14)) {
    uVar8 = 0x1000000 << (8U - (char)*(int *)(lVar6 + 0x14) & 0x1f);
  }
  uVar9 = 0x100 << (8U - *(char *)(lVar6 + 0xc) & 0x1f) | 1 << (bVar7 & 0x1f);
  uVar8 = 0x10000 << (8U - *(char *)(lVar6 + 0x10) & 0x1f) | uVar9 | uVar8;
  uVar10 = 1 << (bVar7 & 0x1f) & 0xff;
  if (0xf7 < uVar10) {
    uVar10 = 0xf8;
  }
  uVar9 = uVar9 >> 8 & 0xff;
  if (0xf7 < uVar9) {
    uVar9 = 0xf8;
  }
  uVar11 = uVar8 >> 0x10 & 0xff;
  if (0xf7 < uVar11) {
    uVar11 = 0xf8;
  }
  uVar8 = uVar8 >> 0x18;
  if (0xf7 < uVar8) {
    uVar8 = 0xf8;
  }
  dVar4 = 0x2601;
  if (this->m_useMipmaps != false) {
    dVar4 = 0x2700;
  }
  local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::computeQuadTexCoordCube(&local_278,face);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_4_ = local_298.order;
  local_1b0._4_4_ = local_298.type;
  std::__cxx11::ostringstream::ostringstream(this_00);
  tcu::operator<<((ostream *)this_00,face);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar5 + 0x1a00))(local_2a8.x,local_2a8.y,local_2a8.width,local_2a8.height);
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0x8513,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2801,dVar4);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2800,0x2600);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSizeTests.cpp"
                  ,0x128);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,TEXTURETYPE_CUBE);
  context = this->m_renderCtx;
  local_20c.wrapS = 8;
  local_20c.wrapT = REPEAT_CL;
  if ((void *)local_290.m_pixels.m_cap != (void *)0x0) {
    local_290.m_pixels.m_cap = (size_t)local_290.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_20c,local_290.m_width,
             local_290.m_height,1,(void *)local_290.m_pixels.m_cap);
  glu::readPixels(context,local_2a8.x,local_2a8.y,(PixelBufferAccess *)local_1b0);
  glu::mapGLSampler(&local_20c,0x812f,0x812f,dVar4,0x2600);
  local_20c.seamlessCubeMap = true;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_1d0,&local_260,(PixelFormat *)(CONCAT44(extraout_var_02,iVar3) + 8));
  texCoord_00 = local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  pTVar1 = this->m_texture;
  local_248.m_levels[5] = (pTVar1->m_refTexture).m_view.m_levels[5];
  local_248.m_numLevels = (pTVar1->m_refTexture).m_view.m_numLevels;
  local_248._4_4_ = *(undefined4 *)&(pTVar1->m_refTexture).m_view.field_0x4;
  local_248.m_levels[0] = (pTVar1->m_refTexture).m_view.m_levels[0];
  local_248.m_levels[1] = (pTVar1->m_refTexture).m_view.m_levels[1];
  local_248.m_levels[2] = (pTVar1->m_refTexture).m_view.m_levels[2];
  local_248.m_levels[3] = (pTVar1->m_refTexture).m_view.m_levels[3];
  local_248.m_levels[4] = (pTVar1->m_refTexture).m_view.m_levels[4];
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_1b0,TEXTURETYPE_CUBE,&local_20c,LODMODE_EXACT);
  glu::TextureTestUtil::sampleTexture
            (&local_1d0,&local_248,texCoord_00,(ReferenceParams *)local_1b0);
  bVar2 = glu::TextureTestUtil::compareImages
                    ((TestLog *)local_298,&local_260,&local_290,
                     (RGBA)(uVar8 * 0x1000000 + (uVar11 << 0x10 | uVar9 * 0x100 + uVar10) +
                           0x7070707));
  if (local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_260);
  tcu::Surface::~Surface(&local_290);
  return bVar2;
}

Assistant:

bool TextureCubeSizeCase::testFace (tcu::CubeFace face)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	RandomViewport			viewport		(m_renderCtx.getRenderTarget(), 128, 128, deStringHash(getName())+(deUint32)face);
	tcu::Surface			renderedFrame	(viewport.width, viewport.height);
	tcu::Surface			referenceFrame	(viewport.width, viewport.height);
	tcu::RGBA				threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(7,7,7,7);
	deUint32				wrapS			= GL_CLAMP_TO_EDGE;
	deUint32				wrapT			= GL_CLAMP_TO_EDGE;
	// Do not minify with GL_NEAREST. A large POT texture with a small POT render target will produce
	// indeterminate results.
	deUint32				minFilter		= m_useMipmaps ? GL_NEAREST_MIPMAP_NEAREST : GL_LINEAR;
	deUint32				magFilter		= GL_NEAREST;
	vector<float>			texCoord;

	computeQuadTexCoordCube(texCoord, face);

	// \todo [2011-10-28 pyry] Image set name / section?
	log << TestLog::Message << face << TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());

	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_CUBE);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	Sampler sampler = mapGLSampler(wrapS, wrapT, minFilter, magFilter);
	sampler.seamlessCubeMap = true;
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], ReferenceParams(TEXTURETYPE_CUBE, sampler));

	// Compare and log.
	return compareImages(log, referenceFrame, renderedFrame, threshold);
}